

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t
duckdb::TimeBucket::BinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts)

{
  interval_t bucket_width_00;
  BucketWidthType BVar1;
  timestamp_t tVar2;
  NotImplementedException *this;
  timestamp_t in_RCX;
  int64_t unaff_RBX;
  interval_t bucket_width_01;
  interval_t bucket_width_02;
  undefined1 *local_40 [2];
  undefined1 local_30 [8];
  undefined8 in_stack_ffffffffffffffd8;
  
  bucket_width_01._0_8_ = bucket_width.micros;
  bucket_width_00.micros = unaff_RBX;
  bucket_width_00._0_8_ = in_stack_ffffffffffffffd8;
  BVar1 = ClassifyBucketWidthErrorThrow(bucket_width_00);
  if (BVar1 == CONVERTIBLE_TO_MONTHS) {
    bucket_width_02.micros = ts.value;
    bucket_width_02.months = (int)bucket_width_01._0_8_;
    bucket_width_02.days = (int)((ulong)bucket_width_01._0_8_ >> 0x20);
    tVar2 = WidthConvertibleToMonthsBinaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
                      ((WidthConvertibleToMonthsBinaryOperator *)bucket_width._0_8_,bucket_width_02,
                       in_RCX);
    return (timestamp_t)tVar2.value;
  }
  if (BVar1 == CONVERTIBLE_TO_MICROS) {
    bucket_width_01.micros = ts.value;
    tVar2 = WidthConvertibleToMicrosBinaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
                      (bucket_width._0_8_,bucket_width_01,in_RCX);
    return (timestamp_t)tVar2.value;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Bucket type not implemented for TIME_BUCKET","");
  duckdb::NotImplementedException::NotImplementedException(this,(string *)local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return WidthConvertibleToMicrosBinaryOperator::Operation<TA, TB, TR>(bucket_width, ts);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return WidthConvertibleToMonthsBinaryOperator::Operation<TA, TB, TR>(bucket_width, ts);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}